

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::ExportSwiftObjectCompileCommand
          (cmNinjaTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *moduleSourceFiles,
          string *moduleObjectFilename,string *flags,string *defines,string *includes,
          string *outputConfig,bool singleOutput)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  pointer ppcVar2;
  cmMakefile *this_01;
  cmSourceFile *source;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *pvVar3;
  pointer pbVar4;
  bool bVar5;
  cmGlobalNinjaGenerator *pcVar6;
  string *psVar7;
  pointer ppcVar8;
  string *cmd;
  pointer s;
  string_view source_00;
  string_view separator;
  string escapedModuleObjectFilename;
  string commandLine;
  string objectFilename;
  string escapedSourceFilenames;
  cmList compileCmds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  RuleVariables compileObjectVars;
  string local_2b8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *local_298;
  long *local_290;
  long local_288;
  long local_280 [2];
  string local_270;
  cmRulePlaceholderExpander *local_250;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string *local_1c8;
  cmList local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  undefined1 local_188 [48];
  char *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  pointer local_130;
  pointer local_f0;
  pointer local_a8;
  pointer local_a0;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_298 = moduleSourceFiles;
  local_1c8 = includes;
  local_188._0_8_ = local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"EXPORT_COMPILE_COMMANDS","");
  bVar5 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)local_188);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (bVar5) {
    pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    psVar7 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,moduleObjectFilename);
    local_290 = local_280;
    pcVar1 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar1,pcVar1 + psVar7->_M_string_length);
    memset(local_188,0,0x158);
    pvVar3 = local_298;
    local_158 = "Swift";
    local_f0 = (flags->_M_dataplus)._M_p;
    local_a8 = (defines->_M_dataplus)._M_p;
    local_a0 = (local_1c8->_M_dataplus)._M_p;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_1a8,
              (long)(local_298->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_298->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppcVar8 = (pvVar3->
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (pvVar3->
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar8 != ppcVar2) {
      do {
        GetCompiledSourceNinjaPath_abi_cxx11_(&local_1e8,this,*ppcVar8);
        bVar5 = cmsys::SystemTools::FileIsFullPath(&local_1e8);
        if (!bVar5) {
          pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
          psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_
                             ((pcVar6->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                              CMakeInstance);
          cmsys::SystemTools::CollapseFullPath(&local_228,&local_1e8,psVar7);
          std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
        }
        source_00._M_str = local_1e8._M_dataplus._M_p;
        source_00._M_len = local_1e8._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_2b8,(cmOutputConverter *)this->LocalGenerator,source_00,SHELL,false);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a8,
                   &local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 != ppcVar2);
    }
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_228,&local_1a8,separator,(string_view)ZEXT816(0));
    local_130 = local_228._M_dataplus._M_p;
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,"CMAKE_Swift_COMPILE_OBJECT","");
    psVar7 = cmMakefile::GetRequiredDefinition(this_01,&local_2b8);
    pvVar3 = local_298;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    cmList::cmList(&local_1c0,psVar7,Yes,No);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_250);
    ppcVar8 = (pvVar3->
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_298 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                (pvVar3->
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    if ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)ppcVar8 != local_298)
    {
      do {
        source = *ppcVar8;
        GetCompiledSourceNinjaPath_abi_cxx11_(&local_2b8,this,source);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,local_290,local_288 + (long)local_290);
        if (!singleOutput) {
          GetObjectFilePath(&local_270,this,source,outputConfig);
          pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
          cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,&local_270);
          std::__cxx11::string::_M_assign((string *)&local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar4 = local_1c0.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p;
        for (s = local_1c0.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; s != pbVar4; s = s + 1) {
          cmRulePlaceholderExpander::ExpandRuleVariables
                    (local_250,(cmOutputConverter *)this->LocalGenerator,s,
                     (RuleVariables *)local_188);
        }
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_270,this->LocalGenerator,&local_1c0.Values,outputConfig,outputConfig,
                   &local_208,(cmGeneratorTarget *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                   local_208.field_2._M_local_buf[0]) + 1);
        }
        pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
        cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar6,&local_270,&local_2b8,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        ppcVar8 = ppcVar8 + 1;
      } while ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)ppcVar8 !=
               local_298);
    }
    if (local_250 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_250->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0.Values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportSwiftObjectCompileCommand(
  std::vector<cmSourceFile const*> const& moduleSourceFiles,
  std::string const& moduleObjectFilename, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& outputConfig, bool singleOutput)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  auto escapeSourceFileName = [this](std::string srcFilename) -> std::string {
    if (!cmSystemTools::FileIsFullPath(srcFilename)) {
      srcFilename =
        cmSystemTools::CollapseFullPath(srcFilename,
                                        this->GetGlobalGenerator()
                                          ->GetCMakeInstance()
                                          ->GetHomeOutputDirectory());
    }

    return this->LocalGenerator->ConvertToOutputFormat(
      srcFilename, cmOutputConverter::SHELL);
  };
  auto escapedModuleObjectFilename =
    this->ConvertToNinjaPath(moduleObjectFilename);

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = "Swift";
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Build up the list of source files in the module
  std::vector<std::string> filenames;
  filenames.reserve(moduleSourceFiles.size());
  for (cmSourceFile const* sf : moduleSourceFiles) {
    filenames.emplace_back(
      escapeSourceFileName(this->GetCompiledSourceNinjaPath(sf)));
  }
  // Note that `escapedSourceFilenames` must remain alive until the
  // compileObjectVars is consumed or Source will be a dangling pointer.
  std::string const escapedSourceFilenames = cmJoin(filenames, " ");
  compileObjectVars.Source = escapedSourceFilenames.c_str();

  std::string const& compileCommand =
    this->Makefile->GetRequiredDefinition("CMAKE_Swift_COMPILE_OBJECT");
  cmList compileCmds(compileCommand);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  for (cmSourceFile const* sf : moduleSourceFiles) {
    std::string const sourceFilename = this->GetCompiledSourceNinjaPath(sf);
    std::string objectFilename = escapedModuleObjectFilename;

    if (!singleOutput) {
      // If it's not single-output, each source file gets a separate object
      objectFilename =
        this->ConvertToNinjaPath(this->GetObjectFilePath(sf, outputConfig));
    }
    compileObjectVars.Objects = objectFilename.c_str();

    for (std::string& cmd : compileCmds) {
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   cmd, compileObjectVars);
    }

    std::string commandLine = this->GetLocalGenerator()->BuildCommandLine(
      compileCmds, outputConfig, outputConfig);

    this->GetGlobalGenerator()->AddCXXCompileCommand(
      commandLine, sourceFilename, objectFilename);
  }
}